

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode parse_connect_to_slist(Curl_easy *data,connectdata *conn,curl_slist *conn_to_host)

{
  byte *pbVar1;
  undefined1 *puVar2;
  byte bVar3;
  int iVar4;
  size_t max;
  char *pcVar5;
  long lVar6;
  byte *pbVar7;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  uint uVar11;
  CURLcode CVar12;
  char *pcVar13;
  byte *pbVar14;
  byte *__s;
  bool bVar15;
  bool bVar16;
  char *local_38;
  
  if (conn_to_host == (curl_slist *)0x0) {
    return CURLE_OK;
  }
LAB_0050098e:
  pcVar13 = conn_to_host->data;
  if (*pcVar13 == ':') {
    pcVar13 = pcVar13 + 1;
    bVar15 = true;
LAB_00500a35:
    if (bVar15) {
      if (*pcVar13 != ':') {
        pcVar5 = strchr(pcVar13,0x3a);
        if (pcVar5 != (char *)0x0) {
          local_38 = (char *)0x0;
          lVar6 = strtol(pcVar13,&local_38,10);
          if (local_38 == pcVar5) {
            bVar16 = lVar6 == conn->remote_port;
            if (bVar16) {
              pcVar13 = pcVar5 + 1;
            }
            goto LAB_00500a88;
          }
        }
        goto LAB_00500a86;
      }
      bVar16 = true;
      pcVar13 = pcVar13 + 1;
    }
    else {
LAB_00500a86:
      bVar16 = false;
    }
LAB_00500a88:
    uVar11 = 0xffffffff;
    if (((!bVar15) || (!bVar16)) || (*pcVar13 == '\0')) {
      pcVar13 = (char *)0x0;
      CVar12 = CURLE_OK;
      goto LAB_00500c74;
    }
    pbVar7 = (byte *)(*Curl_cstrdup)(pcVar13);
    if (pbVar7 == (byte *)0x0) goto LAB_00500b4b;
    pbVar14 = pbVar7;
    __s = pbVar7;
    if (*pbVar7 == 0x5b) {
      pbVar14 = pbVar7 + 1;
      bVar3 = pbVar7[1];
      __s = pbVar14;
      if (bVar3 != 0) {
        __s = pbVar7 + 2;
LAB_00500af0:
        if (((byte)(bVar3 - 0x30) < 10) ||
           ((bVar3 - 0x2e < 0x39 &&
            ((0x1f8000001f81001U >> ((ulong)(bVar3 - 0x2e) & 0x3f) & 1) != 0)))) goto LAB_00500b11;
        if (bVar3 == 0x25) {
          iVar4 = strncmp("%25",(char *)(__s + -1),3);
          if (iVar4 != 0) {
            Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.");
          }
          bVar3 = *__s;
          while ((bVar3 != 0 &&
                 ((((byte)(bVar3 - 0x30) < 10 || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) ||
                  ((bVar3 - 0x2d < 2 || ((bVar3 == 0x7e || (bVar3 == 0x5f))))))))) {
            pbVar1 = __s + 1;
            __s = __s + 1;
            bVar3 = *pbVar1;
          }
          goto LAB_00500b1e;
        }
        goto LAB_00500b1b;
      }
      goto LAB_00500b1e;
    }
    goto LAB_00500b83;
  }
  bVar15 = (*(uint *)&(conn->bits).field_0x4 >> 0xb & 1) == 0;
  pcVar5 = "[";
  if (bVar15) {
    pcVar5 = "";
  }
  pcVar10 = "]";
  if (bVar15) {
    pcVar10 = "";
  }
  bVar15 = false;
  pcVar5 = curl_maprintf("%s%s%s",pcVar5,(conn->host).name,pcVar10);
  if (pcVar5 != (char *)0x0) {
    max = strlen(pcVar5);
    iVar4 = Curl_strncasecompare(pcVar13,pcVar5,max);
    (*Curl_cfree)(pcVar5);
    bVar15 = false;
    if (iVar4 != 0) {
      bVar15 = pcVar13[max] == ':';
    }
    pcVar13 = pcVar13 + max + 1;
  }
  if (pcVar5 != (char *)0x0) goto LAB_00500a35;
LAB_00500b4b:
  CVar12 = CURLE_OUT_OF_MEMORY;
  uVar11 = 0xffffffff;
  pcVar13 = (char *)0x0;
  goto LAB_00500c74;
LAB_00500b11:
  bVar3 = *__s;
  __s = __s + 1;
  if (bVar3 == 0) goto LAB_00500b1b;
  goto LAB_00500af0;
LAB_00500b1b:
  __s = __s + -1;
LAB_00500b1e:
  if (*__s == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else {
    Curl_infof(data,"Invalid IPv6 address format");
  }
LAB_00500b83:
  pcVar13 = strchr((char *)__s,0x3a);
  if (pcVar13 == (char *)0x0) {
    CVar12 = CURLE_OK;
    uVar9 = 0xffffffff;
LAB_00500c37:
    pcVar13 = (*Curl_cstrdup)((char *)pbVar14);
    uVar11 = -(uint)(pcVar13 == (char *)0x0) | uVar9;
    if (pcVar13 == (char *)0x0) {
      CVar12 = CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    local_38 = (char *)0x0;
    *pcVar13 = '\0';
    CVar12 = CURLE_OK;
    uVar11 = 0xffffffff;
    if (pcVar13[1] == '\0') {
      uVar8 = 0xffffffff;
LAB_00500c26:
      uVar9 = (uint)uVar8;
      iVar4 = 0;
    }
    else {
      uVar8 = strtol(pcVar13 + 1,&local_38,10);
      if (((local_38 == (char *)0x0) || (*local_38 == '\0')) && (uVar8 < 0x10000))
      goto LAB_00500c26;
      Curl_failf(data,"No valid port number in connect to host string (%s)",pcVar13 + 1);
      iVar4 = 6;
      CVar12 = CURLE_SETOPT_OPTION_SYNTAX;
      uVar9 = 0xffffffff;
    }
    if (iVar4 != 6) {
      pcVar13 = (char *)0x0;
      if (iVar4 != 0) goto LAB_00500c74;
      goto LAB_00500c37;
    }
    pcVar13 = (char *)0x0;
  }
  (*Curl_cfree)(pbVar7);
LAB_00500c74:
  if (CVar12 != CURLE_OK) {
    return CVar12;
  }
  if ((pcVar13 == (char *)0x0) || (*pcVar13 == '\0')) {
    puVar2 = &(conn->bits).field_0x5;
    *puVar2 = *puVar2 & 0xfd;
    (*Curl_cfree)(pcVar13);
    bVar15 = true;
  }
  else {
    (conn->conn_to_host).rawalloc = pcVar13;
    (conn->conn_to_host).name = pcVar13;
    puVar2 = &(conn->bits).field_0x5;
    *puVar2 = *puVar2 | 2;
    bVar15 = false;
    Curl_infof(data,"Connecting to hostname: %s",pcVar13);
  }
  if ((int)uVar11 < 0) {
    puVar2 = &(conn->bits).field_0x5;
    *puVar2 = *puVar2 & 0xfb;
  }
  else {
    conn->conn_to_port = uVar11;
    puVar2 = &(conn->bits).field_0x5;
    *puVar2 = *puVar2 | 4;
    Curl_infof(data,"Connecting to port: %d",(ulong)uVar11);
  }
  conn_to_host = conn_to_host->next;
  if (!bVar15 || conn_to_host == (curl_slist *)0x0) {
    return CURLE_OK;
  }
  if (-1 < (int)uVar11) {
    return CURLE_OK;
  }
  goto LAB_0050098e;
}

Assistant:

static CURLcode parse_connect_to_slist(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       struct curl_slist *conn_to_host)
{
  CURLcode result = CURLE_OK;
  char *host = NULL;
  int port = -1;

  while(conn_to_host && !host && port == -1) {
    result = parse_connect_to_string(data, conn, conn_to_host->data,
                                     &host, &port);
    if(result)
      return result;

    if(host && *host) {
      conn->conn_to_host.rawalloc = host;
      conn->conn_to_host.name = host;
      conn->bits.conn_to_host = TRUE;

      infof(data, "Connecting to hostname: %s", host);
    }
    else {
      /* no "connect to host" */
      conn->bits.conn_to_host = FALSE;
      Curl_safefree(host);
    }

    if(port >= 0) {
      conn->conn_to_port = port;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Connecting to port: %d", port);
    }
    else {
      /* no "connect to port" */
      conn->bits.conn_to_port = FALSE;
      port = -1;
    }

    conn_to_host = conn_to_host->next;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(data->asi && !host && (port == -1) &&
     ((conn->handler->protocol == CURLPROTO_HTTPS) ||
#ifdef CURLDEBUG
      /* allow debug builds to circumvent the HTTPS restriction */
      getenv("CURL_ALTSVC_HTTP")
#else
      0
#endif
       )) {
    /* no connect_to match, try alt-svc! */
    enum alpnid srcalpnid;
    bool hit;
    struct altsvc *as;
    const int allowed_versions = ( ALPN_h1
#ifdef USE_HTTP2
                                   | ALPN_h2
#endif
#ifdef ENABLE_QUIC
                                   | ALPN_h3
#endif
      ) & data->asi->flags;

    host = conn->host.rawalloc;
#ifdef USE_HTTP2
    /* with h2 support, check that first */
    srcalpnid = ALPN_h2;
    hit = Curl_altsvc_lookup(data->asi,
                             srcalpnid, host, conn->remote_port, /* from */
                             &as /* to */,
                             allowed_versions);
    if(!hit)
#endif
    {
      srcalpnid = ALPN_h1;
      hit = Curl_altsvc_lookup(data->asi,
                               srcalpnid, host, conn->remote_port, /* from */
                               &as /* to */,
                               allowed_versions);
    }
    if(hit) {
      char *hostd = strdup((char *)as->dst.host);
      if(!hostd)
        return CURLE_OUT_OF_MEMORY;
      conn->conn_to_host.rawalloc = hostd;
      conn->conn_to_host.name = hostd;
      conn->bits.conn_to_host = TRUE;
      conn->conn_to_port = as->dst.port;
      conn->bits.conn_to_port = TRUE;
      conn->bits.altused = TRUE;
      infof(data, "Alt-svc connecting from [%s]%s:%d to [%s]%s:%d",
            Curl_alpnid2str(srcalpnid), host, conn->remote_port,
            Curl_alpnid2str(as->dst.alpnid), hostd, as->dst.port);
      if(srcalpnid != as->dst.alpnid) {
        /* protocol version switch */
        switch(as->dst.alpnid) {
        case ALPN_h1:
          conn->httpversion = 11;
          break;
        case ALPN_h2:
          conn->httpversion = 20;
          break;
        case ALPN_h3:
          conn->transport = TRNSPRT_QUIC;
          conn->httpversion = 30;
          break;
        default: /* shouldn't be possible */
          break;
        }
      }
    }
  }
#endif

  return result;
}